

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorBetweenSameUnits_Test::TestBody(Units_scalingFactorBetweenSameUnits_Test *this)

{
  char *pcVar1;
  double local_70;
  AssertHelper local_68 [8];
  UnitsPtr u1;
  AssertionResult gtest_ar;
  double scaling;
  UnitsPtr u2;
  ModelPtr model;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model",(allocator<char> *)&u1);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)&u2);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)&scaling);
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)&scaling);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  scaling = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u1,true);
  local_70 = 1.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","scaling",&local_70,&scaling);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa38,pcVar1);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenSameUnits)
{
    auto model = libcellml::Model::create("model");
    auto u1 = libcellml::Units::create("u1");
    auto u2 = libcellml::Units::create("u2");
    u1->addUnit("u2");
    model->addUnits(u1);
    model->addUnits(u2);
    auto scaling = libcellml::Units::scalingFactor(u1, u1);
    EXPECT_EQ(1.0, scaling);
}